

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 5.test.cpp
# Opt level: O1

string * chunkWithNK0_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 9.223500+4 2.330250+2          0          0          0          09228 5 18     \n-3.000000+7 0.000000+0          0          7          1          29228 5 18     \n          2          2                                            9228 5 18     \n 3.250000+6 1.000000+0 2.000000+7 1.000000+0                      9228 5 18     \n 0.000000+0 0.000000+0          0          0          1          39228 5 18     \n          3          5                                            9228 5 18     \n 3.250000+6 1.295500+6 1.500000+7 1.492300+6 2.000000+7 1.494470+69228 5 18     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkWithNK0() {
  return
    " 9.223500+4 2.330250+2          0          0          0          09228 5 18     \n"
    "-3.000000+7 0.000000+0          0          7          1          29228 5 18     \n"
    "          2          2                                            9228 5 18     \n"
    " 3.250000+6 1.000000+0 2.000000+7 1.000000+0                      9228 5 18     \n"
    " 0.000000+0 0.000000+0          0          0          1          39228 5 18     \n"
    "          3          5                                            9228 5 18     \n"
    " 3.250000+6 1.295500+6 1.500000+7 1.492300+6 2.000000+7 1.494470+69228 5 18     \n";
}